

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O2

float64_t bf_get_float64_be(bfile_t *bfile)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  
  bVar1 = bf_get_uint8(bfile);
  bVar2 = bf_get_uint8(bfile);
  bVar3 = bf_get_uint8(bfile);
  bVar4 = bf_get_uint8(bfile);
  bVar5 = bf_get_uint8(bfile);
  bVar6 = bf_get_uint8(bfile);
  bVar7 = bf_get_uint8(bfile);
  bVar8 = bf_get_uint8(bfile);
  return (float64_t)
         ((ulong)bVar8 |
         (ulong)bVar7 << 8 |
         (ulong)bVar6 << 0x10 |
         (ulong)bVar5 << 0x18 |
         (ulong)bVar4 << 0x20 | (ulong)bVar3 << 0x28 | (ulong)bVar2 << 0x30 | (ulong)bVar1 << 0x38);
}

Assistant:

float64_t
bf_get_float64_be(
    bfile_t * bfile )
{
    union {
        float64_t real;
        uint8_t   bytes[8];
    } data;

#ifndef WORDS_BIGENDIAN
    data.bytes[7] = bf_get_uint8( bfile );
    data.bytes[6] = bf_get_uint8( bfile );
    data.bytes[5] = bf_get_uint8( bfile );
    data.bytes[4] = bf_get_uint8( bfile );
    data.bytes[3] = bf_get_uint8( bfile );
    data.bytes[2] = bf_get_uint8( bfile );
    data.bytes[1] = bf_get_uint8( bfile );
    data.bytes[0] = bf_get_uint8( bfile );
#else /* WORDS_BIGENDIAN */
    data.bytes[0] = bf_get_uint8( bfile );
    data.bytes[1] = bf_get_uint8( bfile );
    data.bytes[2] = bf_get_uint8( bfile );
    data.bytes[3] = bf_get_uint8( bfile );
    data.bytes[4] = bf_get_uint8( bfile );
    data.bytes[5] = bf_get_uint8( bfile );
    data.bytes[6] = bf_get_uint8( bfile );
    data.bytes[7] = bf_get_uint8( bfile );
#endif /* WORDS_BIGENDIAN */

    return data.real;
}